

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

StringRef llvm::sys::path::get_separator(Style style)

{
  Style SVar1;
  undefined1 auStack_38 [4];
  Style style_local;
  char *local_28;
  undefined1 *local_20;
  char *local_18;
  undefined1 *local_10;
  
  SVar1 = anon_unknown.dwarf_21af95::real_style(style);
  if (SVar1 == windows) {
    local_20 = auStack_38;
    local_28 = "\\";
    strlen("\\");
  }
  else {
    local_10 = auStack_38;
    local_18 = "/";
    strlen("/");
  }
  return _auStack_38;
}

Assistant:

StringRef get_separator(Style style) {
  if (real_style(style) == Style::windows)
    return "\\";
  return "/";
}